

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_File * HTS_fopen_from_data(void *data,size_t size)

{
  undefined8 *puVar1;
  void *__dest;
  HTS_File *pHVar2;
  
  if (size == 0 || data == (void *)0x0) {
    return (HTS_File *)0x0;
  }
  puVar1 = (undefined8 *)HTS_calloc(1,0x18);
  __dest = HTS_calloc(size,1);
  *puVar1 = __dest;
  puVar1[1] = size;
  puVar1[2] = 0;
  memcpy(__dest,data,size);
  pHVar2 = (HTS_File *)HTS_calloc(1,0x10);
  pHVar2->type = '\x01';
  pHVar2->pointer = puVar1;
  return pHVar2;
}

Assistant:

HTS_File *HTS_fopen_from_data(void *data, size_t size)
{
   HTS_Data *d;
   HTS_File *f;

   if (data == NULL || size == 0)
      return NULL;

   d = (HTS_Data *) HTS_calloc(1, sizeof(HTS_Data));
   d->data = (unsigned char *) HTS_calloc(size, sizeof(unsigned char));
   d->size = size;
   d->index = 0;

   memcpy(d->data, data, size);

   f = (HTS_File *) HTS_calloc(1, sizeof(HTS_File));
   f->type = HTS_DATA;
   f->pointer = (void *) d;

   return f;
}